

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O3

bool __thiscall QSlider::event(QSlider *this,QEvent *event)

{
  ushort uVar1;
  QSliderPrivate *this_00;
  bool bVar2;
  QHoverEvent *he;
  long in_FS_OFFSET;
  double dVar3;
  undefined1 auVar4 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSliderPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 - 0x7f < 3) {
    auVar4 = QEventPoint::position();
    dVar3 = (double)((ulong)auVar4._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._0_8_;
    bVar2 = 2147483647.0 < dVar3;
    if (dVar3 <= -2147483648.0) {
      dVar3 = -2147483648.0;
    }
    local_28.xp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar3);
    dVar3 = (double)((ulong)auVar4._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar4._8_8_;
    bVar2 = 2147483647.0 < dVar3;
    if (dVar3 <= -2147483648.0) {
      dVar3 = -2147483648.0;
    }
    local_28.yp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar3);
    QSliderPrivate::updateHoverControl(this_00,&local_28);
  }
  else if ((uVar1 == 100) || (uVar1 == 0xb1)) {
    QSliderPrivate::resetLayoutItemMargins(this_00);
  }
  bVar2 = QAbstractSlider::event(&this->super_QAbstractSlider,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSlider::event(QEvent *event)
{
    Q_D(QSlider);

    switch(event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d->updateHoverControl(he->position().toPoint());
        break;
    case QEvent::StyleChange:
    case QEvent::MacSizeChange:
        d->resetLayoutItemMargins();
        break;
    default:
        break;
    }
    return QAbstractSlider::event(event);
}